

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.h
# Opt level: O2

int __thiscall IClient::SendPackMsg<CNetMsg_Cl_Vote>(IClient *this,CNetMsg_Cl_Vote *pMsg,int Flags)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  CMsgPacker Packer;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CMsgPacker::CMsgPacker(&Packer,0x1f,false);
  bVar2 = CNetMsg_Cl_Vote::Pack(pMsg,&Packer);
  if (bVar2) {
    iVar3 = -1;
  }
  else {
    iVar3 = (*(this->super_IInterface)._vptr_IInterface[0x24])(this,&Packer,(ulong)(uint)Flags);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int SendPackMsg(T *pMsg, int Flags)
	{
		CMsgPacker Packer(pMsg->MsgID(), false);
		if(pMsg->Pack(&Packer))
			return -1;
		return SendMsg(&Packer, Flags);
	}